

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

int __thiscall
kj::CapabilityStreamNetworkAddress::connect
          (CapabilityStreamNetworkAddress *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  AsyncCapabilityStream *pAVar1;
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000034;
  Own<kj::AsyncCapabilityStream> result;
  Own<kj::_::PromiseNode> local_a8;
  Own<kj::_::PromiseNode> local_98;
  Own<kj::AsyncCapabilityStream> local_88 [2];
  Own<kj::AsyncCapabilityStream> local_68;
  CapabilityPipe pipe;
  Own<kj::_::PromiseNode> local_38;
  
  (**(code **)(**(long **)(CONCAT44(in_register_00000034,__fd) + 8) + 0x10))(&pipe);
  pAVar1 = pipe.ends[0].ptr;
  result.disposer = pipe.ends[0].disposer;
  result.ptr = pipe.ends[0].ptr;
  pipe.ends[0].ptr = (AsyncCapabilityStream *)0x0;
  local_88[0].disposer._0_4_ = pipe.ends[1].disposer._0_4_;
  local_88[0].disposer._4_4_ = pipe.ends[1].disposer._4_4_;
  local_88[0].ptr._0_4_ = pipe.ends[1].ptr._0_4_;
  local_88[0].ptr._4_4_ = pipe.ends[1].ptr._4_4_;
  pipe.ends[1].ptr = (AsyncCapabilityStream *)0x0;
  (**(code **)(**(long **)(CONCAT44(in_register_00000034,__fd) + 0x10) + 0x58))(&local_a8);
  local_68.disposer = pipe.ends[0].disposer;
  local_68.ptr = pAVar1;
  result.ptr = (AsyncCapabilityStream *)0x0;
  this_00 = (TransformPromiseNodeBase *)operator_new(0x40);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_a8,
             CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>
             ::operator()<>);
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00432318;
  this_00[1].dependency.disposer = local_68.disposer;
  this_00[1].dependency.ptr = (PromiseNode *)local_68.ptr;
  local_68.ptr = (AsyncCapabilityStream *)0x0;
  local_98.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::AsyncIoStream>,kj::_::Void,kj::CaptureByMove<kj::CapabilityStreamNetworkAddress::connect()::$_0,kj::Own<kj::AsyncCapabilityStream>>,kj::_::PropagateException>>
        ::instance;
  local_38.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::AsyncIoStream>,kj::_::Void,kj::CaptureByMove<kj::CapabilityStreamNetworkAddress::connect()::$_0,kj::Own<kj::AsyncCapabilityStream>>,kj::_::PropagateException>>
        ::instance;
  local_98.ptr = (PromiseNode *)0x0;
  (this->super_NetworkAddress)._vptr_NetworkAddress =
       (_func_int **)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::AsyncIoStream>,kj::_::Void,kj::CaptureByMove<kj::CapabilityStreamNetworkAddress::connect()::$_0,kj::Own<kj::AsyncCapabilityStream>>,kj::_::PropagateException>>
        ::instance;
  this->provider = (AsyncIoProvider *)this_00;
  local_38.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_38);
  Own<kj::_::PromiseNode>::dispose(&local_98);
  Own<kj::AsyncCapabilityStream>::dispose(&local_68);
  Own<kj::_::PromiseNode>::dispose(&local_a8);
  Own<kj::AsyncCapabilityStream>::dispose(local_88);
  Own<kj::AsyncCapabilityStream>::dispose(&result);
  CapabilityPipe::~CapabilityPipe(&pipe);
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> CapabilityStreamNetworkAddress::connect() {
  auto pipe = provider.newCapabilityPipe();
  auto result = kj::mv(pipe.ends[0]);
  return inner.sendStream(kj::mv(pipe.ends[1]))
      .then(kj::mvCapture(result, [](Own<AsyncIoStream>&& result) {
    return kj::mv(result);
  }));
}